

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stable_unique_tests.cc
# Opt level: O0

void stable_unique_sorted_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_00;
  stable_unique_sorted t;
  char (*in_stack_fffffffffffff618) [21];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff620;
  std_string *in_stack_fffffffffffff628;
  basic_cstring<const_char> *in_stack_fffffffffffff630;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff640;
  basic_wrap_stringstream<char> *pbVar1;
  stable_unique_sorted *in_stack_fffffffffffff810;
  undefined1 local_728 [16];
  basic_cstring<const_char> local_718;
  undefined1 local_701;
  basic_wrap_stringstream<char> local_700;
  undefined1 local_568 [16];
  basic_cstring<const_char> local_558;
  undefined1 local_541;
  basic_wrap_stringstream<char> local_540;
  undefined1 local_3a8 [16];
  basic_cstring<const_char> local_398;
  undefined1 local_381;
  basic_wrap_stringstream<char> local_380;
  undefined1 local_1e8 [16];
  basic_cstring<const_char> local_1d8;
  undefined1 local_1c5;
  basic_wrap_stringstream<char> local_1b8;
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/stable_unique_tests.cc"
             ,0x76);
  memset(&local_1b8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_1b8);
  local_1c5 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_10,0xc,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/stable_unique_tests.cc"
             ,0x76);
  memset(&local_380,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_380);
  local_381 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [16])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_1d8,0xc,local_1e8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::setup_conditional<stable_unique_sorted>
            ((stable_unique_sorted *)in_stack_fffffffffffff620);
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_398,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/stable_unique_tests.cc"
             ,0x76);
  memset(&local_540,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_540);
  local_541 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_398,0xc,local_3a8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  stable_unique_sorted::test_method(in_stack_fffffffffffff810);
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_558,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/stable_unique_tests.cc"
             ,0x76);
  memset(&local_700,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(&local_700);
  local_701 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [19])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_558,0xc,local_568);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::teardown_conditional<stable_unique_sorted>
            ((stable_unique_sorted *)in_stack_fffffffffffff620);
  pbVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_718,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/stable_unique_tests.cc"
             ,0x76);
  memset((basic_wrap_stringstream<char> *)&stack0xfffffffffffff740,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref
            ((basic_wrap_stringstream<char> *)&stack0xfffffffffffff740);
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  this = boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  s = boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  this_00 = (basic_wrap_stringstream<char> *)
            boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar1);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar1,&local_718,0xc,local_728);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_00);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(stable_unique_sorted)
{
  std::vector<int> v = {1,1,2,2,2,6,78,89,89};
  std::vector<int> expected = {1,2,6,78,89};

  v.erase(stable_unique(v.begin(), v.end()), v.end());

  BOOST_CHECK_EQUAL_COLLECTIONS(v.begin(), v.end(), expected.begin(), expected.end());
}